

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf.c
# Opt level: O0

uint16_t read_uint16(dwarf_buf *buf)

{
  uint16_t *puVar1;
  int iVar2;
  uchar *p;
  dwarf_buf *buf_local;
  
  puVar1 = (uint16_t *)buf->buf;
  iVar2 = advance(buf,2);
  if (iVar2 == 0) {
    buf_local._6_2_ = 0;
  }
  else if (buf->is_bigendian == 0) {
    buf_local._6_2_ = *puVar1;
  }
  else {
    buf_local._6_2_ = CONCAT11((char)*puVar1,*(undefined1 *)((long)puVar1 + 1));
  }
  return buf_local._6_2_;
}

Assistant:

static uint16_t
read_uint16 (struct dwarf_buf *buf)
{
  const unsigned char *p = buf->buf;

  if (!advance (buf, 2))
    return 0;
  if (buf->is_bigendian)
    return ((uint16_t) p[0] << 8) | (uint16_t) p[1];
  else
    return ((uint16_t) p[1] << 8) | (uint16_t) p[0];
}